

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QVariantHash __thiscall QAuthenticator::options(QAuthenticator *this)

{
  long *in_RSI;
  Data *in_RDI;
  Data *pDVar1;
  
  if (*in_RSI == 0) {
    pDVar1 = in_RDI;
    memset(in_RDI,0,8);
    QHash<QString,_QVariant>::QHash((QHash<QString,_QVariant> *)in_RDI);
  }
  else {
    QHash<QString,_QVariant>::QHash
              ((QHash<QString,_QVariant> *)in_RDI,(QHash<QString,_QVariant> *)in_RDI);
    pDVar1 = in_RDI;
  }
  return (QVariantHash)pDVar1;
}

Assistant:

QVariantHash QAuthenticator::options() const
{
    return d ? d->options : QVariantHash();
}